

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatefootprint.cpp
# Opt level: O2

void __thiscall ValidateFootprint::CheckIntensityBins(ValidateFootprint *this)

{
  int *__x;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var1;
  
  __x = &(this->fr_).super_EventRow.intensity_bin_id;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                    ((this->intensityBinIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->intensityBinIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,__x);
  if (_Var1._M_current ==
      (this->intensityBinIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<int,_std::allocator<int>_>::push_back(&this->intensityBinIDs_,__x);
    return;
  }
  fprintf(_stderr,
          "ERROR: Duplicate intensity bin %d on line %d for event ID %d areaperil ID %u:\n%s\n",
          (ulong)(uint)(this->fr_).super_EventRow.intensity_bin_id,
          (ulong)(uint)(this->super_Validate).lineno_,(ulong)(uint)(this->fr_).event_id,
          (ulong)(this->fr_).super_EventRow.areaperil_id,&this->super_Validate);
  Validate::PrintErrorMessage(&this->super_Validate);
  return;
}

Assistant:

inline void ValidateFootprint::CheckIntensityBins() {

  if (find(intensityBinIDs_.begin(), intensityBinIDs_.end(),
           fr_.intensity_bin_id) == intensityBinIDs_.end()) {

    intensityBinIDs_.push_back(fr_.intensity_bin_id);

    return;

  }

  fprintf(stderr, "ERROR: Duplicate intensity bin %d on line %d"
		  " for event ID %d areaperil ID %u:\n%s\n",
	  fr_.intensity_bin_id, lineno_, fr_.event_id, fr_.areaperil_id, line_);
  PrintErrorMessage();

}